

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O2

void av1_setup_frame_size(AV1_COMP *cpi)

{
  SUPERRES_AUTO_SEARCH_TYPE SVar1;
  RESIZE_MODE RVar2;
  aom_enc_pass aVar3;
  int iVar4;
  aom_superres_mode aVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint uVar13;
  int extraout_EDX;
  int iVar14;
  uint superres_denom;
  int encode_width;
  int iStack_44;
  byte local_40;
  int bottom_index;
  uint local_38;
  int top_index;
  
  superres_denom = 8;
  (cpi->common).superres_scale_denominator = '\b';
  encode_width = (cpi->oxcf).frm_dim_cfg.width;
  iStack_44 = (cpi->oxcf).frm_dim_cfg.height;
  local_40 = 8;
  aVar3 = (cpi->oxcf).pass;
  iVar14 = encode_width;
  iVar10 = iStack_44;
  if (aVar3 == AOM_RC_FIRST_PASS) goto LAB_009591f6;
  if (((aVar3 == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) && (cpi->ppi->use_svc != 0)) {
    iVar14 = (cpi->common).width;
    iVar10 = (cpi->common).height;
    if (iVar10 != iStack_44 || iVar14 != encode_width) goto LAB_009591f6;
  }
  iVar14 = encode_width;
  iVar10 = iStack_44;
  if (cpi->compressor_stage == '\x01') goto LAB_009591f6;
  iVar14 = (cpi->resize_pending_params).width;
  if ((iVar14 == 0) || (iVar10 = (cpi->resize_pending_params).height, iVar10 == 0)) {
    superres_denom = 8;
    uVar13 = 8;
    if (((cpi->common).seq_params)->reduced_still_picture_hdr == '\0') {
      RVar2 = (cpi->oxcf).resize_cfg.resize_mode;
      if (RVar2 == '\x02') {
        calculate_next_resize_scale_seed = calculate_next_resize_scale_seed * 0x41c64e6d + 0x3039;
        uVar13 = (uint)(byte)((char)((calculate_next_resize_scale_seed >> 0x10 & 0x7fff) % 9) + 8);
      }
      else {
        uVar13 = 8;
        if (RVar2 == '\x01') {
          if ((cpi->common).current_frame.frame_type == '\0') {
            uVar13 = (uint)(cpi->oxcf).resize_cfg.resize_kf_scale_denominator;
          }
          else {
            uVar13 = (uint)(cpi->oxcf).resize_cfg.resize_scale_denominator;
          }
        }
      }
    }
    av1_calculate_scaled_size(&encode_width,&iStack_44,uVar13);
    if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01'))
    goto LAB_00958e5e;
  }
  else {
    (cpi->resize_pending_params).width = 0;
    (cpi->resize_pending_params).height = 0;
    encode_width = iVar14;
    iStack_44 = iVar10;
    if ((cpi->oxcf).superres_cfg.superres_mode == AOM_SUPERRES_NONE) goto LAB_009591f6;
LAB_00958e5e:
    superres_denom = 8;
    switch(cpi->superres_mode) {
    case AOM_SUPERRES_FIXED:
switchD_00958e80_caseD_1:
      if ((cpi->common).current_frame.frame_type == '\0') {
        superres_denom = (uint)(cpi->oxcf).superres_cfg.superres_kf_scale_denominator;
      }
      else {
        superres_denom = (uint)(cpi->oxcf).superres_cfg.superres_scale_denominator;
      }
      break;
    case AOM_SUPERRES_RANDOM:
      calculate_next_superres_scale_seed = calculate_next_superres_scale_seed * 0x41c64e6d + 0x3039;
      superres_denom =
           (uint)(byte)((char)((calculate_next_superres_scale_seed >> 0x10 & 0x7fff) % 9) + 8);
      break;
    case AOM_SUPERRES_QTHRESH:
      if ((cpi->common).features.allow_screen_content_tools == false) {
        if (((cpi->oxcf).rc_cfg.mode & ~AOM_CQ) == AOM_VBR) {
          av1_set_target_rate(cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height);
        }
        iVar10 = av1_rc_pick_q_and_bounds
                           (cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                            (uint)cpi->gf_frame_index,&bottom_index,&top_index);
        uVar11 = (ulong)(((cpi->common).current_frame.frame_type & 0xfd) == 0);
        superres_denom = 8;
        iVar14 = extraout_EDX;
        if ((cpi->oxcf).tile_cfg.tile_widths[uVar11 - 0x1d] < iVar10) {
LAB_00958fe7:
          bVar9 = get_superres_denom_for_qindex(cpi,iVar10,iVar14,(int)uVar11);
          superres_denom = (uint)bVar9;
        }
      }
      break;
    case AOM_SUPERRES_AUTO:
      if ((cpi->common).features.allow_screen_content_tools == false) {
        if (((cpi->oxcf).rc_cfg.mode & ~AOM_CQ) == AOM_VBR) {
          av1_set_target_rate(cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height);
        }
        uVar12 = 0;
        iVar10 = av1_rc_pick_q_and_bounds
                           (cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                            (uint)cpi->gf_frame_index,&bottom_index,&top_index);
        SVar1 = (cpi->sf).hl_sf.superres_auto_search_type;
        uVar11 = CONCAT71((int7)((ulong)uVar12 >> 8),SVar1);
        iVar14 = (uint)(SVar1 == '\x02') * 0x80;
        superres_denom = 8;
        if (iVar10 != iVar14 &&
            SBORROW4(iVar10,iVar14) == (int)(iVar10 + (uint)(SVar1 == '\x02') * -0x80) < 0) {
          if (SVar1 != '\0') goto LAB_00958fe7;
          goto switchD_00958e80_caseD_1;
        }
      }
    }
  }
  bVar9 = (byte)superres_denom;
  iVar4 = (cpi->oxcf).frm_dim_cfg.width;
  iVar14 = encode_width;
  iVar10 = iStack_44;
  local_40 = bVar9;
  if (encode_width * 8 < (int)(superres_denom * iVar4) / 2) {
    RVar2 = (cpi->oxcf).resize_cfg.resize_mode;
    aVar5 = cpi->superres_mode;
    iVar6 = (cpi->oxcf).frm_dim_cfg.height;
    uVar11 = (long)((encode_width >> 1) + iVar4 * 8) / (long)encode_width;
    uVar7 = (long)((iStack_44 >> 1) + iVar6 * 8) / (long)iStack_44;
    if ((int)uVar7 < (int)uVar11) {
      uVar7 = uVar11;
    }
    uVar11 = uVar7 & 0xffffffff;
    if (aVar5 == AOM_SUPERRES_RANDOM && RVar2 != '\x02') {
      lVar8 = 0x80 / (long)(int)uVar7;
      bVar9 = (byte)lVar8;
      superres_denom =
           (uint)(byte)(bVar9 - (8 < bVar9 &&
                                encode_width * 8 < (int)(iVar4 * ((uint)lVar8 & 0xff)) / 2));
    }
    else if (aVar5 == AOM_SUPERRES_RANDOM || RVar2 != '\x02') {
      uVar13 = superres_denom;
      if (aVar5 == AOM_SUPERRES_RANDOM && RVar2 == '\x02') {
        do {
          if ((int)uVar13 < (int)uVar11) {
            uVar11 = (ulong)((int)uVar11 - 1);
          }
          else {
            local_40 = (char)uVar13 - 1;
          }
          encode_width = iVar4;
          iStack_44 = iVar6;
          av1_calculate_scaled_size(&encode_width,&iStack_44,(int)uVar11);
          superres_denom = (uint)local_40;
          iVar14 = encode_width;
          iVar10 = iStack_44;
        } while ((encode_width << 3 < (int)((uint)local_40 * iVar4) / 2) &&
                (superres_denom = (uint)local_40, uVar13 = (uint)local_40,
                8 < local_40 || 8 < (int)uVar11));
      }
    }
    else {
      local_38 = (uint)(0x80 / bVar9);
      encode_width = iVar4;
      iStack_44 = iVar6;
      av1_calculate_scaled_size(&encode_width,&iStack_44,local_38);
      superres_denom = (uint)local_40;
      iVar14 = encode_width;
      iVar10 = iStack_44;
      if ((bVar9 < 0xf) && (encode_width << 3 < (int)((uint)local_40 * iVar4) / 2)) {
        encode_width = iVar4;
        iStack_44 = iVar6;
        av1_calculate_scaled_size(&encode_width,&iStack_44,local_38 - 1);
        superres_denom = (uint)local_40;
        iVar14 = encode_width;
        iVar10 = iStack_44;
      }
    }
  }
LAB_009591f6:
  iStack_44 = iVar10;
  encode_width = iVar14;
  bottom_index = iStack_44;
  (cpi->common).superres_upscaled_width = encode_width;
  (cpi->common).superres_upscaled_height = iStack_44;
  (cpi->common).superres_scale_denominator = (uint8_t)superres_denom;
  av1_calculate_scaled_superres_size(&encode_width,&bottom_index,superres_denom);
  av1_set_frame_size(cpi,encode_width,bottom_index);
  return;
}

Assistant:

void av1_setup_frame_size(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  // Reset superres params from previous frame.
  cm->superres_scale_denominator = SCALE_NUMERATOR;
  const size_params_type rsz = calculate_next_size_params(cpi);
  setup_frame_size_from_params(cpi, &rsz);

  assert(av1_is_min_tile_width_satisfied(cm));
}